

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonWriter.h
# Opt level: O2

void anurbs::JsonWriter<anurbs::Model>::save_stream<std::__cxx11::stringstream>
               (Model *model,
               basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *stream)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  key_type *pkVar4;
  pointer pbVar5;
  ostream *poVar6;
  char *pcVar7;
  ulong index;
  long local_110;
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_100;
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_f0;
  string key;
  string type;
  Json data;
  string_t local_90;
  string local_70;
  iterator it;
  
  poVar6 = (ostream *)(stream + 0x10);
  poVar2 = std::operator<<(poVar6,"[");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_110 = 0;
  for (index = 0;
      index < (ulong)((long)(model->m_entry_map).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(model->m_entry_map).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); index = index + 1) {
    Model::get_type_abi_cxx11_(&type,model,index);
    Model::get_key_abi_cxx11_(&key,model,index);
    nlohmann::
    basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(&data,(nullptr_t)0x0);
    if (key._M_string_length != 0) {
      nlohmann::
      basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_f0,&key);
      pvVar3 = nlohmann::
               basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&data,"key");
      nlohmann::
      basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=(pvVar3,&local_f0);
      nlohmann::
      basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_f0);
    }
    nlohmann::
    basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_100,&type);
    pvVar3 = nlohmann::
             basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)&data,"type");
    nlohmann::
    basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(pvVar3,&local_100);
    nlohmann::
    basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_100);
    std::__cxx11::string::string((string *)&local_70,(string *)&type);
    bVar1 = TypeRegistry<anurbs::Model>::save(&local_70,model,index,&data);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar1) {
      pcVar7 = ",\n  {\n";
      if (local_110 == 0) {
        pcVar7 = "  {\n";
      }
      std::operator<<(poVar6,pcVar7);
      nlohmann::
      basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::begin(&it,&data);
      nlohmann::
      basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::end((iterator *)&local_90,&data);
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator!=(&it,(iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                *)&local_90);
      if (bVar1) {
        poVar2 = std::operator<<(poVar6,"    \"");
        pkVar4 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::key(&it);
        poVar2 = std::operator<<(poVar2,(string *)pkVar4);
        poVar2 = std::operator<<(poVar2,"\": ");
        pbVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator->(&it);
        nlohmann::
        basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::dump(&local_90,pbVar5,-1,' ',false,strict);
        std::operator<<(poVar2,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++(&it);
      while( true ) {
        nlohmann::
        basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::end((iterator *)&local_90,&data);
        bVar1 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::operator!=(&it,(iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                  *)&local_90);
        if (!bVar1) break;
        poVar2 = std::operator<<(poVar6,",\n    \"");
        pkVar4 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::key(&it);
        poVar2 = std::operator<<(poVar2,(string *)pkVar4);
        poVar2 = std::operator<<(poVar2,"\": ");
        pbVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator->(&it);
        nlohmann::
        basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::dump(&local_90,pbVar5,-1,' ',false,strict);
        std::operator<<(poVar2,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::operator++(&it);
      }
      std::operator<<(poVar6,"\n  }");
      local_110 = local_110 + 1;
    }
    nlohmann::
    basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&data);
    std::__cxx11::string::~string((string *)&key);
    std::__cxx11::string::~string((string *)&type);
  }
  poVar2 = std::operator<<(poVar6,"\n]");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

static void save_stream(const TModel& model, TStream& stream)
    {
        stream << "[" << std::endl;

        size_t write_count = 0;

        for (size_t i = 0; i < model.nb_entries(); i++) {
            const auto type = model.get_type(i);
            const auto key = model.get_key(i);

            Json data;

            if (!key.empty()) {
                data["key"] = key;
            }
            data["type"] = type;

            if (!TypeRegistry<TModel>::save(type, model, i, data)) {
                continue;
            }

            if (write_count == 0) {
                stream << "  {\n";
            } else {
                stream << ",\n  {\n";
            }

            auto it = data.begin();
            if (it != data.end()) {
                stream << "    \"" << it.key() << "\": " << it->dump();
            }
            for (++it; it != data.end(); ++it) {
                stream << ",\n    \"" << it.key() << "\": " << it->dump();
            }

            stream << "\n  }";

            write_count += 1;
        }

        stream << "\n]" << std::endl;
    }